

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O2

int amqp_simple_wait_frame_noblock
              (amqp_connection_state_t state,amqp_frame_t *decoded_frame,timeval *timeout)

{
  amqp_link_t *paVar1;
  amqp_link_t_ *paVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  size_t sVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  int iVar9;
  uint64_t start;
  ulong uVar10;
  char *fmt;
  timeval *timeout_00;
  ulong uVar11;
  ulong uVar12;
  timeval tStack_70;
  amqp_frame_t aStack_60;
  
  paVar1 = state->first_queued_frame;
  if (paVar1 != (amqp_link_t *)0x0) {
    paVar2 = paVar1->next;
    puVar3 = (undefined8 *)paVar1->data;
    state->first_queued_frame = paVar2;
    if (paVar2 == (amqp_link_t_ *)0x0) {
      state->last_queued_frame = (amqp_link_t *)0x0;
    }
    uVar4 = *puVar3;
    sVar5 = puVar3[1];
    pvVar6 = (void *)puVar3[2];
    pvVar7 = (void *)puVar3[3];
    pvVar8 = (void *)puVar3[5];
    (decoded_frame->payload).properties.raw.len = puVar3[4];
    (decoded_frame->payload).properties.raw.bytes = pvVar8;
    (decoded_frame->payload).method.decoded = pvVar6;
    (decoded_frame->payload).properties.decoded = pvVar7;
    decoded_frame->frame_type = (char)uVar4;
    decoded_frame->field_0x1 = (char)((ulong)uVar4 >> 8);
    decoded_frame->channel = (short)((ulong)uVar4 >> 0x10);
    *(int *)&decoded_frame->field_0x4 = (int)((ulong)uVar4 >> 0x20);
    (decoded_frame->payload).body_fragment.len = sVar5;
    return 0;
  }
  if ((timeout != (timeval *)0x0) && ((timeout->tv_sec < 0 || (timeout->tv_usec < 0)))) {
    return -10;
  }
  start = 0;
  uVar11 = 0;
  uVar12 = 0;
  timeout_00 = (timeval *)0x0;
LAB_00109ad8:
  while (state->sock_inbound_offset < state->sock_inbound_limit) {
    iVar9 = consume_one_frame(state,decoded_frame);
    if (iVar9 != 0) {
      return iVar9;
    }
    if (decoded_frame->frame_type != '\0') {
      if (decoded_frame->frame_type != '\b') {
        return 0;
      }
      amqp_maybe_release_buffers_on_channel(state,0);
    }
  }
  do {
    if ((timeout != (timeval *)0x0) || (0 < state->heartbeat)) {
      start = amqp_get_monotonic_timestamp();
      if (start == 0) {
        return -0xe;
      }
      if ((0 < state->heartbeat) && (state->next_send_heartbeat < start)) {
        aStack_60.channel = 0;
        aStack_60.frame_type = '\b';
        iVar9 = amqp_send_frame(state,&aStack_60);
        if (iVar9 != 0) {
          return iVar9;
        }
        start = amqp_get_monotonic_timestamp();
        if (start == 0) {
          return -0xe;
        }
      }
      if (timeout == (timeval *)0x0) {
        if (state->heartbeat < 1) {
          fmt = "Internal error: both timeout == NULL && state->heartbeat == 0";
          goto LAB_00109cab;
        }
LAB_00109bf5:
        uVar10 = state->next_recv_heartbeat;
        if (state->next_recv_heartbeat < start) {
          state->next_recv_heartbeat = start;
          uVar10 = start;
        }
        uVar12 = state->next_send_heartbeat;
        if (uVar10 < state->next_send_heartbeat) {
          uVar12 = uVar10;
        }
        if ((timeout != (timeval *)0x0) && (uVar11 < uVar12)) {
          uVar12 = uVar11;
        }
      }
      else {
        uVar12 = uVar11;
        if (uVar11 == 0) {
          uVar12 = timeout->tv_usec * 1000 + timeout->tv_sec * 1000000000 + start;
        }
        if (uVar12 < start) {
          return -0xd;
        }
        uVar11 = uVar12;
        if (0 < state->heartbeat) goto LAB_00109bf5;
      }
      tStack_70.tv_sec = (uVar12 - start) / 1000000000;
      tStack_70.tv_usec = ((uVar12 - start) % 1000000000) / 1000;
      timeout_00 = &tStack_70;
    }
    iVar9 = recv_with_timeout(state,start,timeout_00);
    if (iVar9 != -0xd) break;
    if (uVar12 == state->next_recv_heartbeat) {
      (*state->socket->klass->close)(state->socket);
      return -0xf;
    }
    if (uVar12 == uVar11) {
      return -0xd;
    }
    if (uVar12 != state->next_send_heartbeat) {
      fmt = "Internal error: unable to determine timeout reason";
LAB_00109cab:
      amqp_abort(fmt);
    }
  } while( true );
  if (iVar9 != 0) {
    return iVar9;
  }
  goto LAB_00109ad8;
}

Assistant:

int amqp_simple_wait_frame_noblock(amqp_connection_state_t state,
                                   amqp_frame_t *decoded_frame,
                                   struct timeval *timeout)
{
  if (state->first_queued_frame != NULL) {
    amqp_frame_t *f = (amqp_frame_t *) state->first_queued_frame->data;
    state->first_queued_frame = state->first_queued_frame->next;
    if (state->first_queued_frame == NULL) {
      state->last_queued_frame = NULL;
    }
    *decoded_frame = *f;
    return AMQP_STATUS_OK;
  } else {
    return wait_frame_inner(state, decoded_frame, timeout);
  }
}